

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.h
# Opt level: O2

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnFunctionName
          (BinaryReaderIR *this,Index index,string_view name)

{
  Module *pMVar1;
  string_view name_00;
  string *orig_name;
  string dollar_name;
  char *in_stack_ffffffffffffff78;
  Func *pFVar2;
  undefined1 local_78 [72];
  
  orig_name = (string *)name.size_;
  if (orig_name != (string *)0x0) {
    pMVar1 = this->module_;
    pFVar2 = (pMVar1->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl
             .super__Vector_impl_data._M_start[index];
    name_00.size_ = (size_type)pFVar2;
    name_00.data_ = in_stack_ffffffffffffff78;
    (anonymous_namespace)::MakeDollarName_abi_cxx11_(name_00);
    GetUniqueName((string *)(local_78 + 0x28),(BinaryReaderIR *)&pMVar1->func_bindings,
                  (BindingHash *)local_78,orig_name);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_assign((string *)pFVar2);
    local_78._16_4_ = 0;
    local_78._20_8_ = 0;
    local_78._0_8_ = (__buckets_ptr)0x0;
    local_78._8_4_ = 0;
    local_78._12_4_ = 0;
    local_78._32_4_ = index;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
    ::_M_emplace<std::__cxx11::string&,wabt::Binding>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                *)&this->module_->func_bindings,(string *)(local_78 + 0x28),local_78);
    std::__cxx11::string::_M_dispose();
  }
  return (Result)Ok;
}

Assistant:

constexpr inline bool string_view::empty() const noexcept {
  return size_ == 0;
}